

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
rebalance_right_to_left
          (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          *right,allocator_type *alloc)

{
  ulong uVar1;
  bool bVar2;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  bVar3;
  long lVar4;
  long lVar5;
  char *__function;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar6;
  int iVar7;
  int iVar8;
  
  if ((((ulong)this & 7) == 0) && (((ulong)right & 7) == 0)) {
    uVar1 = *(ulong *)this;
    if (uVar1 != *(ulong *)right) {
      __assert_fail("parent() == right->parent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fc,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
      __assert_fail("position() + 1 == right->position()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fd,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    bVar3 = this[10];
    if ((byte)right[10] < (byte)bVar3) {
      __assert_fail("right->count() >= count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fe,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if (to_move < 1) {
      __assert_fail("to_move >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5ff,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if ((int)(uint)(byte)right[10] < to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x600,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if ((uVar1 & 7) == 0) {
      *(undefined4 *)(this + (ulong)(byte)bVar3 * 4 + 0xc) =
           *(undefined4 *)(uVar1 + 0xc + (ulong)(byte)this[8] * 4);
      uninitialized_move_n(right,(ulong)(to_move - 1U),0,(ulong)(byte)bVar3 + 1,this,alloc);
      if ((*(ulong *)this & 7) == 0) {
        *(undefined4 *)(*(ulong *)this + 0xc + (ulong)(byte)this[8] * 4) =
             *(undefined4 *)(right + (long)(int)(to_move - 1U) * 4 + 0xc);
        if ((ulong)(uint)to_move != (ulong)(byte)right[10]) {
          pbVar6 = right + 0xc;
          lVar4 = (ulong)(uint)to_move * 4;
          lVar5 = (ulong)(byte)right[10] << 2;
          do {
            *(undefined4 *)pbVar6 = *(undefined4 *)(pbVar6 + lVar4);
            pbVar6 = pbVar6 + 4;
            lVar5 = lVar5 + -4;
          } while (lVar4 != lVar5);
        }
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
             )0x0) {
          iVar8 = 1;
          if (1 < to_move) {
            iVar8 = to_move;
          }
          iVar7 = 0;
          do {
            bVar3 = this[10];
            pbVar6 = child(right,iVar7);
            init_child(this,iVar7 + (uint)(byte)bVar3 + 1,pbVar6);
            iVar7 = iVar7 + 1;
          } while (iVar8 != iVar7);
          if (to_move <= (int)(uint)(byte)right[10]) {
            iVar8 = 0;
            do {
              iVar7 = to_move + iVar8;
              bVar3 = right[0xb];
              if (right[0xb] ==
                  (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   )0x0) {
                bVar3 = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                         )0x3d;
              }
              if ((int)(uint)(byte)bVar3 < iVar7) {
                __assert_fail("i + to_move <= right->max_count()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                              ,0x618,
                              "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                             );
              }
              pbVar6 = child(right,iVar7);
              init_child(right,iVar8,pbVar6);
              mutable_child(right,iVar7);
              bVar2 = iVar8 < (int)((uint)(byte)right[10] - to_move);
              iVar8 = iVar8 + 1;
            } while (bVar2);
          }
        }
        this[10] = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    )((char)this[10] + (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                     )((char)right[10] - (char)to_move);
        return;
      }
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  value_init(count(), alloc, parent()->slot(position()));

  // 2) Move the (to_move - 1) values from the right node to the left node.
  right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  slot_type::move(alloc, right->slot(to_move - 1), parent()->slot(position()));

  // 4) Shift the values in the right node to their correct position.
  slot_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                  right->slot(0));

  // 5) Destroy the now-empty to_move entries in the right node.
  right->value_destroy_n(right->count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the right to the left node.
    for (int i = 0; i < to_move; ++i) {
      init_child(count() + i + 1, right->child(i));
    }
    for (int i = 0; i <= right->count() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() + to_move);
  right->set_count(right->count() - to_move);
}